

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O0

void If_ManSetupCutTriv(If_Man_t *p,If_Cut_t *pCut,int ObjId)

{
  uint uVar1;
  int local_24;
  float local_20;
  int ObjId_local;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  *(uint *)&pCut->field_0x1c = *(uint *)&pCut->field_0x1c & 0xffffefff;
  *(uint *)&pCut->field_0x1c =
       *(uint *)&pCut->field_0x1c & 0xff00ffff | (p->pPars->nLutSize & 0xffU) << 0x10;
  *(uint *)&pCut->field_0x1c = *(uint *)&pCut->field_0x1c & 0xffffff | 0x1000000;
  local_20 = (float)ObjId;
  if (p->pPars->fLiftLeaves != 0) {
    local_20 = (float)(ObjId << 8);
  }
  pCut[1].Area = local_20;
  uVar1 = If_ObjCutSign((uint)pCut[1].Area);
  pCut->uSign = uVar1;
  if (p->pPars->fUseTtPerm == 0) {
    local_24 = -1;
    if (p->pPars->fTruth != 0) {
      local_24 = 2;
    }
  }
  else {
    local_24 = 3;
  }
  pCut->iCutFunc = local_24;
  pCut->uMaskFunc = 0;
  if (p->vObjs->nSize <= (int)pCut[1].Area) {
    __assert_fail("pCut->pLeaves[0] < p->vObjs->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifMan.c"
                  ,0x20c,"void If_ManSetupCutTriv(If_Man_t *, If_Cut_t *, int)");
  }
  return;
}

Assistant:

void If_ManSetupCutTriv( If_Man_t * p, If_Cut_t * pCut, int ObjId )
{
    pCut->fCompl     = 0;
    pCut->nLimit     = p->pPars->nLutSize;
    pCut->nLeaves    = 1;
    pCut->pLeaves[0] = p->pPars->fLiftLeaves? (ObjId << 8) : ObjId;
    pCut->uSign      = If_ObjCutSign( pCut->pLeaves[0] );
    pCut->iCutFunc   = p->pPars->fUseTtPerm ? 3 : (p->pPars->fTruth ? 2: -1);
    pCut->uMaskFunc  = 0;
    assert( pCut->pLeaves[0] < p->vObjs->nSize );
}